

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O3

void __thiscall slang::JsonWriter::writeQuoted(JsonWriter *this,string_view str)

{
  char *pcVar1;
  size_type newCapacity;
  size_t sVar2;
  size_t sVar3;
  char buf [5];
  char c;
  SmallVector<char,_40UL> vec;
  undefined4 local_88;
  char local_82;
  byte local_81;
  JsonWriter *local_80;
  char *local_78;
  SmallVectorBase<char> local_70 [2];
  
  pcVar1 = str._M_str;
  sVar3 = str._M_len;
  local_80 = this;
  SmallVector<char,_40UL>::SmallVector((SmallVector<char,_40UL> *)local_70,sVar3 + 2);
  local_88 = CONCAT31(local_88._1_3_,0x22);
  SmallVectorBase<char>::emplace_back<char>(local_70,(char *)&local_88);
  if (sVar3 != 0) {
    sVar2 = 0;
    local_78 = pcVar1;
    do {
      local_81 = pcVar1[sVar2];
      switch(local_81) {
      case 8:
        local_88._0_1_ = '\\';
        SmallVectorBase<char>::emplace_back<char>(local_70,(char *)&local_88);
        local_88 = CONCAT31(local_88._1_3_,0x62);
        SmallVectorBase<char>::emplace_back<char>(local_70,(char *)&local_88);
        break;
      case 9:
        local_88._0_1_ = '\\';
        SmallVectorBase<char>::emplace_back<char>(local_70,(char *)&local_88);
        local_88 = CONCAT31(local_88._1_3_,0x74);
        SmallVectorBase<char>::emplace_back<char>(local_70,(char *)&local_88);
        break;
      case 10:
        local_88._0_1_ = '\\';
        SmallVectorBase<char>::emplace_back<char>(local_70,(char *)&local_88);
        local_88 = CONCAT31(local_88._1_3_,0x6e);
        SmallVectorBase<char>::emplace_back<char>(local_70,(char *)&local_88);
        break;
      case 0xb:
switchD_001d074c_caseD_b:
        if (local_81 < 0x20) {
          snprintf((char *)&local_88,5,"%04x");
          local_82 = '\\';
          SmallVectorBase<char>::emplace_back<char>(local_70,&local_82);
          local_82 = 'u';
          SmallVectorBase<char>::emplace_back<char>(local_70,&local_82);
          newCapacity = local_70[0].len + 4;
          SmallVectorBase<char>::reserve(local_70,newCapacity);
          *(undefined4 *)(local_70[0].data_ + local_70[0].len) = local_88;
          pcVar1 = local_78;
          local_70[0].len = newCapacity;
        }
        else {
          SmallVectorBase<char>::emplace_back<char_const&>(local_70,(char *)&local_81);
        }
        break;
      case 0xc:
        local_88._0_1_ = '\\';
        SmallVectorBase<char>::emplace_back<char>(local_70,(char *)&local_88);
        local_88 = CONCAT31(local_88._1_3_,0x66);
        SmallVectorBase<char>::emplace_back<char>(local_70,(char *)&local_88);
        break;
      case 0xd:
        local_88._0_1_ = '\\';
        SmallVectorBase<char>::emplace_back<char>(local_70,(char *)&local_88);
        local_88 = CONCAT31(local_88._1_3_,0x72);
        SmallVectorBase<char>::emplace_back<char>(local_70,(char *)&local_88);
        break;
      default:
        if (local_81 == 0x5c) {
          local_88._0_1_ = '\\';
          SmallVectorBase<char>::emplace_back<char>(local_70,(char *)&local_88);
          local_88 = CONCAT31(local_88._1_3_,0x5c);
          SmallVectorBase<char>::emplace_back<char>(local_70,(char *)&local_88);
        }
        else {
          if (local_81 != 0x22) goto switchD_001d074c_caseD_b;
          local_88._0_1_ = '\\';
          SmallVectorBase<char>::emplace_back<char>(local_70,(char *)&local_88);
          local_88 = CONCAT31(local_88._1_3_,0x22);
          SmallVectorBase<char>::emplace_back<char>(local_70,(char *)&local_88);
        }
      }
      sVar2 = sVar2 + 1;
    } while (sVar3 != sVar2);
  }
  local_88 = CONCAT31(local_88._1_3_,0x22);
  SmallVectorBase<char>::emplace_back<char>(local_70,(char *)&local_88);
  ::fmt::v11::detail::buffer<char>::append<char>
            ((buffer<char> *)
             (local_80->buffer)._M_t.
             super___uniq_ptr_impl<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>.
             _M_t.
             super__Tuple_impl<0UL,_slang::FormatBuffer_*,_std::default_delete<slang::FormatBuffer>_>
             .super__Head_base<0UL,_slang::FormatBuffer_*,_false>._M_head_impl,local_70[0].data_,
             local_70[0].data_ + local_70[0].len);
  if (local_70[0].data_ != local_70[0].firstElement) {
    operator_delete(local_70[0].data_);
  }
  return;
}

Assistant:

void JsonWriter::writeQuoted(std::string_view str) {
    SmallVector<char> vec(str.size() + 2, UninitializedTag());
    vec.push_back('"');
    for (char c : str) {
        switch (c) {
            case '"':
                vec.push_back('\\');
                vec.push_back('"');
                break;
            case '\\':
                vec.push_back('\\');
                vec.push_back('\\');
                break;
            case '\b':
                vec.push_back('\\');
                vec.push_back('b');
                break;
            case '\f':
                vec.push_back('\\');
                vec.push_back('f');
                break;
            case '\n':
                vec.push_back('\\');
                vec.push_back('n');
                break;
            case '\r':
                vec.push_back('\\');
                vec.push_back('r');
                break;
            case '\t':
                vec.push_back('\\');
                vec.push_back('t');
                break;
            default:
#if CHAR_MIN < 0
                if (c >= 0x00 and c <= 0x1f) {
#else
                if (c <= 0x1f) {
#endif
                    // print character c as \uxxxx
                    char buf[5];
                    snprintf(buf, sizeof(buf), "%04x", int(c));
                    vec.push_back('\\');
                    vec.push_back('u');
                    vec.append(buf, buf + 4);
                }
                else {
                    // all other characters are added as-is
                    vec.push_back(c);
                }
                break;
        }
    }

    vec.push_back('"');
    buffer->append(toStringView(vec));
}

void JsonWriter::endValue() {
    buffer->append(",");
    if (pretty)
        buffer->format("\n{:{}}", "", currentIndent);
}

size_t JsonWriter::findLastComma() const {
    size_t size = buffer->size();
    if (pretty) {
        while (size && (buffer->data()[size - 1] == ' ' || buffer->data()[size - 1] == '\n'))
            size--;
    }

    if (size && buffer->data()[size - 1] == ',')
        size--;

    return size;
}

}